

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void embree::SceneGraph::optimize_animation(Ref<embree::SceneGraph::Node> *node)

{
  Node *pNVar1;
  long *plVar2;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *pvVar3;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *pvVar4;
  bool bVar5;
  long *plVar6;
  byte bVar7;
  long *plVar8;
  long lVar9;
  size_t i;
  ulong uVar10;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar1 = node->ptr;
  if (pNVar1 != (Node *)0x0) {
    plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar6 == (long *)0x0) {
      plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GroupNode::typeinfo,0);
      if (plVar6 == (long *)0x0) {
        plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        if (plVar6 == (long *)0x0) {
          plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          if (plVar6 == (long *)0x0) {
            plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&HairSetNode::typeinfo,0);
            if (plVar6 == (long *)0x0) {
              plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&PointSetNode::typeinfo,0);
              if (plVar6 == (long *)0x0) {
                plVar6 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&SubdivMeshNode::typeinfo,0);
                if (plVar6 != (long *)0x0) {
                  (**(code **)(*plVar6 + 0x10))(plVar6);
                  bVar7 = 1;
                  lVar9 = 0x20;
                  for (uVar10 = 1;
                      pvVar3 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                *)plVar6[0xe], uVar10 < (ulong)(plVar6[0xf] - (long)pvVar3 >> 5);
                      uVar10 = uVar10 + 1) {
                    bVar5 = operator==(pvVar3,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                               *)(&pvVar3->field_0x0 + lVar9));
                    bVar7 = bVar7 & bVar5;
                    lVar9 = lVar9 + 0x20;
                  }
                  if (bVar7 != 0) {
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(plVar6 + 0xe),1);
                  }
                  (**(code **)(*plVar6 + 0x18))(plVar6);
                }
              }
              else {
                (**(code **)(*plVar6 + 0x10))(plVar6);
                bVar7 = 1;
                lVar9 = 0x20;
                for (uVar10 = 1;
                    pvVar4 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                              *)plVar6[0xf], uVar10 < (ulong)(plVar6[0x10] - (long)pvVar4 >> 5);
                    uVar10 = uVar10 + 1) {
                  bVar5 = operator==(pvVar4,(vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                                             *)(&pvVar4->field_0x0 + lVar9));
                  bVar7 = bVar7 & bVar5;
                  lVar9 = lVar9 + 0x20;
                }
                if (bVar7 != 0) {
                  std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)(plVar6 + 0xf),1);
                }
                (**(code **)(*plVar6 + 0x18))(plVar6);
              }
            }
            else {
              (**(code **)(*plVar6 + 0x10))(plVar6);
              bVar7 = 1;
              lVar9 = 0x20;
              for (uVar10 = 1;
                  pvVar4 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                            *)plVar6[0xf], uVar10 < (ulong)(plVar6[0x10] - (long)pvVar4 >> 5);
                  uVar10 = uVar10 + 1) {
                bVar5 = operator==(pvVar4,(vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                                           *)(&pvVar4->field_0x0 + lVar9));
                bVar7 = bVar7 & bVar5;
                lVar9 = lVar9 + 0x20;
              }
              if (bVar7 != 0) {
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          *)(plVar6 + 0xf),1);
              }
              (**(code **)(*plVar6 + 0x18))(plVar6);
            }
          }
          else {
            (**(code **)(*plVar6 + 0x10))(plVar6);
            bVar7 = 1;
            lVar9 = 0x20;
            for (uVar10 = 1;
                pvVar3 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                          *)plVar6[0xe], uVar10 < (ulong)(plVar6[0xf] - (long)pvVar3 >> 5);
                uVar10 = uVar10 + 1) {
              bVar5 = operator==(pvVar3,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                         *)(&pvVar3->field_0x0 + lVar9));
              bVar7 = bVar7 & bVar5;
              lVar9 = lVar9 + 0x20;
            }
            if (bVar7 != 0) {
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        *)(plVar6 + 0xe),1);
            }
            (**(code **)(*plVar6 + 0x18))(plVar6);
          }
        }
        else {
          (**(code **)(*plVar6 + 0x10))(plVar6);
          bVar7 = 1;
          lVar9 = 0x20;
          for (uVar10 = 1;
              pvVar3 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *
                       )plVar6[0xe], uVar10 < (ulong)(plVar6[0xf] - (long)pvVar3 >> 5);
              uVar10 = uVar10 + 1) {
            bVar5 = operator==(pvVar3,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                       *)(&pvVar3->field_0x0 + lVar9));
            bVar7 = bVar7 & bVar5;
            lVar9 = lVar9 + 0x20;
          }
          if (bVar7 != 0) {
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      *)(plVar6 + 0xe),1);
          }
          (**(code **)(*plVar6 + 0x18))(plVar6);
        }
      }
      else {
        (**(code **)(*plVar6 + 0x10))(plVar6);
        plVar2 = (long *)plVar6[0xe];
        for (plVar8 = (long *)plVar6[0xd]; plVar8 != plVar2; plVar8 = plVar8 + 1) {
          pNVar1 = (Node *)*plVar8;
          local_40.ptr = pNVar1;
          if (pNVar1 != (Node *)0x0) {
            (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
          }
          optimize_animation(&local_40);
          if (pNVar1 != (Node *)0x0) {
            (*(pNVar1->super_RefCount)._vptr_RefCount[3])(pNVar1);
          }
        }
        (**(code **)(*plVar6 + 0x18))(plVar6);
      }
    }
    else {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      pNVar1 = (Node *)plVar6[0x13];
      local_38.ptr = pNVar1;
      if (pNVar1 != (Node *)0x0) {
        (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
      }
      optimize_animation(&local_38);
      if (pNVar1 != (Node *)0x0) {
        (*(pNVar1->super_RefCount)._vptr_RefCount[3])(pNVar1);
      }
      (**(code **)(*plVar6 + 0x18))(plVar6);
    }
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::print(std::ostream& cout, int depth) {
    cout << "HairSetNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }